

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O3

int struct_size_field_list(FMFieldList list,int pointer_size)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  FMFieldList p_Var6;
  long elements;
  uint local_44;
  FMFieldList local_40;
  int local_38 [2];
  
  if (list->field_name == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    lVar5 = 0;
    iVar3 = 0;
    do {
      p_Var6 = list + lVar5;
      uVar2 = IOget_array_size_dimen(p_Var6->field_type,list,0,&local_44);
      if (uVar2 == 0) {
LAB_0013fa9e:
        FMarray_str_to_data_type(p_Var6->field_type,local_38);
        iVar4 = p_Var6->field_size * local_38[0];
        if (iVar4 < 1) {
          __assert_fail("field_size > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp_compat.c"
                        ,0x48,"int struct_size_field_list(FMFieldList, int)");
        }
      }
      else {
        bVar1 = false;
        iVar4 = 1;
        local_40 = p_Var6;
        do {
          p_Var6 = local_40;
          if ((uVar2 & local_44) == 0xffffffff) goto LAB_0013fa9e;
          if (local_44 != 0xffffffff) {
            bVar1 = true;
          }
          uVar2 = IOget_array_size_dimen(list[lVar5].field_type,list,iVar4,&local_44);
          iVar4 = iVar4 + 1;
        } while (uVar2 != 0);
        iVar4 = 8;
        p_Var6 = local_40;
        if (!bVar1) goto LAB_0013fa9e;
      }
      iVar4 = iVar4 + p_Var6->field_offset;
      if (iVar3 <= iVar4) {
        iVar3 = iVar4;
      }
      lVar5 = lVar5 + 1;
    } while (list[lVar5].field_name != (char *)0x0);
  }
  return iVar3;
}

Assistant:

static
int
struct_size_field_list(FMFieldList list, int pointer_size)
{
    int i = 0;
    int struct_size = 0;
    while (list[i].field_name != NULL) {
	int field_size = 0;
	if (is_var_array_field(list, i) == 1) {
	    /* variant array, real_field_size is ioformat->pointer_size */
	    field_size = pointer_size;
	} else {
	    long elements;
	    FMarray_str_to_data_type(list[i].field_type, &elements);
	    field_size = list[i].field_size * elements;
	}
	assert(field_size > 0);
	struct_size = Max(struct_size,
			  (list[i].field_offset + field_size));
/*	printf("i=%d field_name=%s field_type=%s struct_size= %d, offset=%d size=%d\n", i, list[i].field_name, list[i].field_type, struct_size, list[i].field_offset, field_size);*/
	i++;
    }
    return struct_size;
}